

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockFailureTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MockFailureTest_expectedCallDidNotHappen_TestShell::createTest
          (TEST_MockFailureTest_expectedCallDidNotHappen_TestShell *this)

{
  TEST_MockFailureTest_expectedCallDidNotHappen_Test *this_00;
  
  this_00 = (TEST_MockFailureTest_expectedCallDidNotHappen_Test *)
            operator_new(0x48,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockFailureTest.cpp"
                         ,0x7e);
  TEST_MockFailureTest_expectedCallDidNotHappen_Test::
  TEST_MockFailureTest_expectedCallDidNotHappen_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MockFailureTest, expectedCallDidNotHappen)
{
    call1->withName("foobar");
    call2->withName("world").withParameter("boo", 2).withParameter("hello", "world");
    call3->withName("haphaphap");
    call3->callWasMade(1);
    addThreeCallsToList();

    MockExpectedCallsDidntHappenFailure failure(UtestShell::getCurrent(), *list);
    STRCMP_EQUAL("Mock Failure: Expected call WAS NOT fulfilled.\n"
                 "\tEXPECTED calls that WERE NOT fulfilled:\n"
                 "\t\tfoobar -> no parameters (expected 1 call, called 0 times)\n"
                 "\t\tworld -> int boo: <2 (0x2)>, const char* hello: <world> (expected 1 call, called 0 times)\n"
                 "\tEXPECTED calls that WERE fulfilled:\n"
                 "\t\thaphaphap -> no parameters (expected 1 call, called 1 time)", failure.getMessage().asCharString());
}